

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_base.h
# Opt level: O0

void * density::detail::
       LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
       ::get_unaligned_element(ControlBlock *i_control,bool i_is_external)

{
  undefined8 local_20;
  void *result;
  bool i_is_external_local;
  ControlBlock *i_control_local;
  
  local_20 = (undefined8 *)address_add(i_control,0x18);
  if (i_is_external) {
    local_20 = (undefined8 *)*local_20;
  }
  return local_20;
}

Assistant:

static void *
              get_unaligned_element(ControlBlock * i_control, bool i_is_external) noexcept
            {
                auto result = address_add(i_control, s_element_min_offset);
                if (i_is_external)
                {
                    /* i_control and s_element_min_offset are aligned to
                        alignof(ExternalBlock), so we don't need to align further */
                    result = static_cast<ExternalBlock *>(result)->m_block;
                }
                return result;
            }